

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void av1_mc_flow_dispenser_row
               (AV1_COMP *cpi,TplTxfmStats *tpl_txfm_stats,TplBuffers *tpl_tmp_buffers,MACROBLOCK *x
               ,int mi_row,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  int32_t *piVar3;
  byte bVar4;
  byte bVar5;
  _Bool _Var6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int_mv iVar10;
  AV1_PRIMARY *pAVar11;
  YV12_BUFFER_CONFIG *pYVar12;
  AV1_PRIMARY *pAVar13;
  YV12_BUFFER_CONFIG *pYVar14;
  center_mv_t cVar15;
  center_mv_t cVar16;
  scale_factors *scale;
  TplDepStats *pTVar17;
  uint uVar18;
  uint8_t *puVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  PREDICTION_MODE mode_00;
  short sVar22;
  int mi_ext_col;
  FULLPEL_MV FVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  MB_MODE_INFO *pMVar27;
  uint8_t *puVar28;
  search_site_config *search_sites;
  buf_2d *pbVar29;
  int iVar30;
  undefined4 uVar31;
  int iVar32;
  long lVar33;
  int *cost_list_00;
  long lVar34;
  short sVar35;
  int iVar36;
  int iVar37;
  uint8_t *dst;
  MB_MODE_INFO **ppMVar38;
  ulong uVar39;
  undefined2 *puVar40;
  int cmp_rf_idx;
  uint dst_stride;
  int iVar41;
  PREDICTION_MODE mode;
  PREDICTION_MODE mode_01;
  ulong uVar42;
  buf_2d *pbVar43;
  int iVar44;
  uint uVar45;
  ulong uVar46;
  char cVar47;
  uint uVar48;
  int iVar49;
  undefined4 in_register_00000084;
  long lVar50;
  byte bVar51;
  undefined7 in_register_00000089;
  byte bVar52;
  int bh;
  int i;
  int iVar53;
  AV1_COMP *cpi_00;
  AV1TplRowMultiThreadSync *pAVar54;
  buf_2d (*pabVar55) [3];
  int_mv *cur_mv;
  bool bVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  TX_SIZE TVar61;
  TplTxfmStats *in_stack_fffffffffffffa98;
  uint local_554;
  int rate_cost;
  uint local_54c;
  long local_548;
  int_mv this_mv;
  byte local_539;
  ulong local_538;
  ulong local_530;
  uint local_524;
  uint8_t *local_520;
  undefined8 local_518;
  ulong local_510;
  uint8_t *local_508;
  ulong local_500;
  AV1_COMP *local_4f8;
  int64_t recon_error;
  SequenceHeader *local_4e8;
  uint8_t *local_4e0;
  undefined8 local_4d8;
  undefined4 local_4cc;
  int local_4c8;
  int_mv best_rfidx_mv;
  tran_low_t *local_4c0;
  int16_t *local_4b8;
  TplDepFrame *local_4b0;
  int64_t pred_error;
  int local_49c;
  ulong local_498;
  AV1_COMMON *local_490;
  MACROBLOCKD *local_488;
  tran_low_t *local_480;
  tran_low_t *local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  BitDepthInfo local_458;
  int local_44c;
  int local_448;
  uint local_444;
  int local_440;
  int local_43c;
  int_mv local_438;
  int rec_stride_pool [3];
  uint local_420;
  center_mv_t center_mvs [4];
  long local_3c8;
  FULLPEL_MV_STATS best_mv_stats;
  int cost_list [5];
  uint8_t *local_348;
  uint8_t *local_340;
  uint8_t *puStack_338;
  long local_328;
  long local_320;
  AV1TplRowMultiThreadSync *local_318;
  ulong local_310;
  ulong local_308;
  TplDepFrame *local_300;
  buf_2d *local_2f8;
  MB_MODE_INFO_EXT *local_2f0;
  ulong local_2e8;
  InterpFilterParams *local_2e0;
  InterpFilterParams *local_2d8;
  uint32_t sse;
  int distortion;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  TplDepStats tpl_stats;
  int_mv single_mv [7];
  buf_2d yv12_mb [2] [3];
  
  local_500 = CONCAT44(in_register_00000084,mi_row);
  local_4cc = (undefined4)CONCAT71(in_register_00000089,bsize);
  local_498 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar4 = ""[local_498];
  iVar9 = (cpi->common).mi_params.mi_cols;
  bVar5 = ""[local_498];
  pAVar11 = cpi->ppi;
  iVar53 = ((1 << (bVar5 & 0x1f)) >> 1) + mi_row >> (bVar5 & 0x1f);
  dst_stride = 4 << (bVar4 & 0x1f);
  local_300 = (pAVar11->tpl_data).tpl_frame + (pAVar11->tpl_data).frame_idx;
  bh = 4 << (bVar5 & 0x1f);
  local_308 = 0x3efffcL >> (bsize & 0x3f);
  local_310 = 0x20005L >> (bsize & 0x3f);
  local_320 = (long)(int)dst_stride;
  uVar25 = 0;
  if (0 < (int)dst_stride) {
    uVar25 = (ulong)dst_stride;
  }
  local_2d8 = av1_interp_filter_params_list;
  local_2e0 = av1_interp_filter_params_list;
  if ((int)dst_stride < 5) {
    local_2e0 = av1_interp_4tap;
  }
  if (bh < 5) {
    local_2d8 = av1_interp_4tap;
  }
  bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_498];
  pAVar54 = &(pAVar11->tpl_data).tpl_mt_sync;
  local_490 = &cpi->common;
  local_4c8 = mi_row * 4;
  local_488 = &x->e_mbd;
  local_444 = (uint)bVar5 * 4;
  local_510 = (ulong)tx_size;
  local_44c = dst_stride - 1;
  local_2f0 = &x->mbmi_ext;
  local_328 = local_320 * 2;
  local_2f8 = (x->e_mbd).plane[0].pre;
  local_49c = 0;
  iVar41 = 0;
  uVar26 = 0;
  local_539 = bVar5;
  local_4f8 = cpi;
  local_448 = iVar53;
  local_318 = pAVar54;
  do {
    if ((cpi->common).mi_params.mi_cols <= (int)uVar26) {
      return;
    }
    local_538 = uVar26;
    (*(cpi->mt_info).tpl_row_mt.sync_read_ptr)(pAVar54,iVar53,iVar41);
    if (1 < (cpi->mt_info).num_workers) {
      pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).tpl_row_mt.mutex_);
      _Var6 = (cpi->mt_info).tpl_row_mt.tpl_mt_exit;
      pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).tpl_row_mt.mutex_);
      if (_Var6 != false) {
        return;
      }
    }
    uVar39 = local_538;
    local_54c = CONCAT31(local_54c._1_3_,(local_310 & 1) == 0);
    iVar53 = (pAVar11->tpl_data).border_in_pixels;
    iVar37 = (int)local_538;
    iVar36 = 8 - (iVar53 + iVar37 * 4);
    uVar18 = (uint)bVar5;
    uVar48 = uVar18 + iVar37;
    uVar26 = (ulong)uVar48;
    iVar44 = uVar48 * -4 + -8;
    if (iVar44 < iVar36) {
      iVar44 = iVar36;
    }
    (x->mv_limits).col_min = iVar44;
    iVar36 = (cpi->common).mi_params.mi_cols;
    iVar30 = iVar36 - iVar37;
    iVar44 = iVar30 * 4 + 8;
    iVar53 = iVar53 + (iVar30 - uVar18) * 4 + -8;
    if (iVar53 < iVar44) {
      iVar44 = iVar53;
    }
    (x->mv_limits).col_max = iVar44;
    (x->e_mbd).mb_to_left_edge = iVar37 * -0x20;
    iVar36 = iVar36 - uVar48;
    (x->e_mbd).mb_to_right_edge = iVar36 * 8;
    local_520 = (uint8_t *)(ulong)(uint)(x->e_mbd).bd;
    pYVar12 = (x->e_mbd).cur_buf;
    uVar45 = pYVar12->flags;
    pAVar13 = cpi->ppi;
    local_4b0 = (pAVar13->tpl_data).tpl_frame;
    lVar33 = (long)(pAVar13->tpl_data).frame_idx;
    local_4e8 = (SequenceHeader *)(lVar33 * 0x60);
    bVar7 = (pAVar13->tpl_data).tpl_stats_block_mis_log2;
    iVar53 = (pYVar12->field_0).field_0.y_width;
    iVar44 = (pYVar12->field_4).field_0.y_stride;
    pYVar14 = local_4b0[lVar33].rec_picture;
    local_548 = CONCAT44(local_548._4_4_,iVar44);
    local_508 = (pYVar12->field_5).buffers[0] + (iVar44 * local_4c8 + iVar37 * 4);
    rec_stride_pool[0] = (pYVar14->field_4).field_0.y_stride;
    local_518 = (ulong)rec_stride_pool[0];
    local_4e0 = (pYVar14->field_5).field_0.y_buffer;
    local_470 = (ulong)(uint)(cpi->sf).tpl_sf.use_y_only_rate_distortion;
    local_340 = (pYVar14->field_5).field_0.u_buffer;
    puStack_338 = (pYVar14->field_5).field_0.v_buffer;
    rec_stride_pool[1] = (pYVar14->field_4).field_0.uv_stride;
    uVar24 = pYVar12->subsampling_x;
    uVar57 = pYVar12->subsampling_y;
    (x->e_mbd).plane[1].subsampling_x = uVar24;
    (x->e_mbd).plane[1].subsampling_y = uVar57;
    (x->e_mbd).plane[2].subsampling_x = uVar24;
    (x->e_mbd).plane[2].subsampling_y = uVar57;
    uVar45 = uVar45 >> 3 & 1;
    local_458 = (BitDepthInfo)(ulong)uVar45;
    dst = (uint8_t *)((ulong)tpl_tmp_buffers->predictor8 >> 1);
    if (uVar45 == 0) {
      dst = tpl_tmp_buffers->predictor8;
    }
    local_4b8 = tpl_tmp_buffers->src_diff;
    local_4c0 = tpl_tmp_buffers->coeff;
    local_480 = tpl_tmp_buffers->qcoeff;
    local_478 = tpl_tmp_buffers->dqcoeff;
    recon_error = 1;
    pred_error = 1;
    rec_stride_pool[2] = rec_stride_pool[1];
    local_348 = local_4e0;
    memset(&tpl_stats,0,200);
    tpl_stats.ref_frame_index[0] = -1;
    tpl_stats.ref_frame_index[1] = -1;
    bVar8 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_498];
    iVar44 = (cpi->common).mi_params.mi_stride;
    uVar45 = (uint)local_500;
    iVar32 = (int)((long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | local_500 & 0xffffffff) /
                  (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                   [(cpi->common).mi_params.mi_alloc_bsize]);
    iVar30 = (int)((long)((ulong)(uint)(iVar37 >> 0x1f) << 0x20 | uVar39 & 0xffffffff) /
                  (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                   [(cpi->common).mi_params.mi_alloc_bsize]);
    iVar49 = iVar44 * uVar45 + iVar37;
    (cpi->common).mi_params.mi_grid_base[iVar49] =
         (cpi->common).mi_params.mi_alloc +
         ((cpi->common).mi_params.mi_alloc_stride * iVar32 + iVar30);
    ppMVar38 = (cpi->common).mi_params.mi_grid_base + iVar49;
    (x->e_mbd).mi = ppMVar38;
    (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar49;
    local_468 = (ulong)bVar8;
    (x->e_mbd).tx_type_map_stride = iVar44;
    x->mbmi_ext_frame =
         (cpi->mbmi_ext_info).frame_base + (iVar32 * (cpi->mbmi_ext_info).stride + iVar30);
    iVar44 = (cpi->common).mi_params.mi_rows;
    (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
    (x->e_mbd).mb_to_bottom_edge = ((iVar44 - (uint)bVar8) - uVar45) * 0x20;
    (x->e_mbd).mb_to_left_edge = iVar37 * -0x20;
    (x->e_mbd).mb_to_right_edge = iVar36 * 0x20;
    (x->e_mbd).mi_row = uVar45;
    (x->e_mbd).mi_col = iVar37;
    iVar44 = (x->e_mbd).tile.mi_row_start;
    iVar36 = (x->e_mbd).tile.mi_col_start;
    (x->e_mbd).left_available = iVar36 < iVar37;
    (x->e_mbd).up_available = iVar44 < (int)uVar45;
    (x->e_mbd).chroma_up_available = iVar44 < (int)uVar45;
    bVar56 = iVar36 < iVar37 + -1;
    if (uVar24 == 0) {
      bVar56 = iVar36 < iVar37;
    }
    if ((local_308 & 1) != 0) {
      bVar56 = iVar36 < iVar37;
    }
    (x->e_mbd).chroma_left_available = bVar56;
    uVar58 = uVar45;
    if (uVar57 != 0 && (char)local_54c == '\0') {
      (x->e_mbd).chroma_up_available = iVar44 < (int)(mi_row - 1U);
      uVar58 = mi_row - 1U;
    }
    if (iVar44 < (int)uVar45) {
      pMVar27 = ppMVar38[-(long)(x->e_mbd).mi_stride];
    }
    else {
      pMVar27 = (MB_MODE_INFO *)0x0;
    }
    (x->e_mbd).above_mbmi = pMVar27;
    if (iVar36 < (int)(uint)local_538) {
      pMVar27 = ppMVar38[-1];
    }
    else {
      pMVar27 = (MB_MODE_INFO *)0x0;
    }
    (x->e_mbd).left_mbmi = pMVar27;
    if ((((local_500 & 1) == 0) && (uVar57 != 0)) && ((bVar8 & 1) != 0)) {
      (x->e_mbd).is_chroma_ref = false;
    }
    else {
      if ((local_538 & 1) == 0 && (local_539 & 1) != 0) {
        (x->e_mbd).is_chroma_ref = uVar24 == 0;
        if (uVar24 != 0) goto LAB_0020b6e1;
      }
      else {
        (x->e_mbd).is_chroma_ref = true;
      }
      iVar37 = (x->e_mbd).mi_stride;
      iVar36 = (uVar24 & (uint)local_538) + (uVar57 & uVar45) * iVar37;
      if (iVar44 < (int)uVar58) {
        pMVar27 = ppMVar38[(long)-iVar36 + (long)(int)(uVar24 - iVar37)];
      }
      else {
        pMVar27 = (MB_MODE_INFO *)0x0;
      }
      (x->e_mbd).chroma_above_mbmi = pMVar27;
      if (bVar56 == false) {
        pMVar27 = (MB_MODE_INFO *)0x0;
      }
      else {
        pMVar27 = ppMVar38[(long)-iVar36 + (long)(int)(iVar37 * uVar57) + -1];
      }
      (x->e_mbd).chroma_left_mbmi = pMVar27;
    }
LAB_0020b6e1:
    (x->e_mbd).height = bVar8;
    (x->e_mbd).width = local_539;
    (x->e_mbd).is_last_vertical_rect = false;
    if ((local_539 < bVar8) && ((uVar48 & bVar8 - 1) == 0)) {
      (x->e_mbd).is_last_vertical_rect = true;
    }
    local_43c = (uint)local_538 * 4;
    local_4b0 = (TplDepFrame *)((long)local_4b0->ref_map_index + (long)local_4e8 + -0x20);
    iVar37 = (int)local_518;
    local_458 = (BitDepthInfo)((long)local_458 << 0x20 | (ulong)local_520);
    local_520 = local_4e0 + (int)(iVar37 * local_4c8 + (uint)local_538 * 4);
    (x->e_mbd).is_first_horizontal_rect = bVar8 < local_539 && (bVar5 - 1 & uVar45) == 0;
    lVar33 = 0xa30;
    if (((local_4f8->common).seq_params)->monochrome == '\0') {
      lVar33 = 0x1e90;
    }
    for (lVar50 = 0; lVar33 != lVar50; lVar50 = lVar50 + 0xa30) {
      bVar51 = (byte)((uint)bVar8 * 4 >>
                     (*(byte *)((long)((x->e_mbd).plane[0].pre + -2) + 0x18 + lVar50) & 0x1f));
      bVar52 = (byte)(local_444 >>
                     (*(byte *)((long)((x->e_mbd).plane[0].pre + -2) + 0x14 + lVar50) & 0x1f));
      if (bVar52 < 5) {
        bVar52 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar50 + 0x90) = bVar52;
      if (bVar51 < 5) {
        bVar51 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar50 + 0x91) = bVar51;
    }
    pMVar27 = *ppMVar38;
    pMVar27->bsize = (BLOCK_SIZE)local_4cc;
    pMVar27->motion_mode = '\0';
    pMVar27->ref_frame[0] = '\0';
    if (((x->e_mbd).left_available == true) &&
       ((int)(tx_size_high_unit[local_510] + uVar45) < (x->e_mbd).tile.mi_row_end)) {
      if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
        puVar28 = local_4e0 + (long)(iVar37 * local_4c8 + local_49c) + local_320 * local_518 + -1;
        uVar39 = uVar25;
        while (bVar56 = uVar39 != 0, uVar39 = uVar39 - 1, bVar56) {
          *puVar28 = local_520[(long)(iVar37 * local_44c) + -1];
          puVar28 = puVar28 + local_518;
        }
      }
      else {
        puVar40 = (undefined2 *)(local_328 * local_518 + (long)local_520 * 2 + -2);
        uVar39 = uVar25;
        while (bVar56 = uVar39 != 0, uVar39 = uVar39 - 1, bVar56) {
          *puVar40 = *(undefined2 *)((long)local_520 * 2 + -2 + (long)(iVar37 * local_44c) * 2);
          puVar40 = puVar40 + local_518;
        }
      }
    }
    local_4e8 = (local_4f8->common).seq_params;
    uVar31 = 3;
    if ((local_4f8->sf).tpl_sf.prune_intra_modes == 0) {
      uVar31 = 0xd;
    }
    local_4e0 = (uint8_t *)CONCAT44(local_4e0._4_4_,uVar31);
    local_54c = (uint)block_size_wide[local_498];
    local_530 = CONCAT44(local_530._4_4_,(uint)block_size_high[local_498]);
    local_524 = 0x7fffffff;
    mode_01 = '\0';
    mode_00 = '\0';
    while( true ) {
      TVar61 = (TX_SIZE)local_510;
      if ((PREDICTION_MODE)local_4e0 == mode_01) break;
      av1_predict_intra_block
                (local_488,local_4e8->sb_size,(uint)local_4e8->enable_intra_edge_filter,local_54c,
                 (int)local_530,TVar61,mode_01,0,0,'\x05',local_520,(int)local_518,dst,dst_stride,0,
                 0,0);
      if (*(int *)((long)local_4b0 + 0x5c) == 0) {
        uVar45 = tpl_get_satd_cost(local_458,local_4b8,dst_stride,local_508,(int)local_548,dst,
                                   dst_stride,local_4c0,dst_stride,bh,TVar61);
      }
      else {
        uVar45 = (*local_4f8->ppi->fn_ptr[local_498].sdf)(local_508,(int)local_548,dst,dst_stride);
      }
      if ((int)uVar45 < (int)local_524) {
        local_524 = uVar45;
        mode_00 = mode_01;
      }
      mode_01 = mode_01 + '\x01';
    }
    if (*(int *)((long)local_4b0 + 0x5c) != 0) {
      av1_predict_intra_block
                (local_488,local_4e8->sb_size,(uint)local_4e8->enable_intra_edge_filter,
                 (uint)block_size_wide[local_498],(uint)block_size_high[local_498],TVar61,mode_00,0,
                 0,'\x05',local_520,(int)local_518,dst,dst_stride,0,0,0);
      local_524 = tpl_get_satd_cost(local_458,local_4b8,dst_stride,local_508,(int)local_548,dst,
                                    dst_stride,local_4c0,dst_stride,bh,TVar61);
    }
    rate_cost = 1;
    local_3c8 = 1;
    iVar37 = (int)local_500;
    iVar44 = (int)local_538;
    lVar33 = 1;
    if (local_4f8->use_ducky_encode != 0) {
      get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b8,local_4c0,local_480,
                          local_478,local_490,x,(YV12_BUFFER_CONFIG **)0x0,&local_348,
                          rec_stride_pool,(TX_SIZE)local_510,mode_00,iVar37,iVar44,(int)local_470,1,
                          in_stack_fffffffffffffa98);
      tpl_stats.intra_dist = recon_error << 4;
      local_3c8 = pred_error;
      tpl_stats.intra_sse = pred_error << 4;
      tpl_stats.intra_rate = rate_cost;
      lVar33 = recon_error;
    }
    (*(x->e_mbd).mi)->ref_frame[0] = '\0';
    (*(x->e_mbd).mi)->ref_frame[1] = -1;
    puVar1 = &(*(x->e_mbd).mi)->field_0xa7;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x200;
    local_440 = iVar37 - (int)local_468 >> (bVar7 & 0x1f);
    local_420 = (uint)bVar5;
    local_4d8 = 0x8000800080008000;
    local_554 = 0x7fffffff;
    uVar39 = 0;
    local_460 = 0xffffffffffffffff;
    cpi_00 = local_4f8;
    uVar31 = local_4cc;
    while( true ) {
      uVar46 = local_460;
      local_518 = CONCAT44(local_518._4_4_,uVar31) & 0xffffffff000000ff;
      if (uVar39 == 7) break;
      single_mv[uVar39].as_int = 0x80008000;
      if (((pAVar13->tpl_data).ref_frame[uVar39] == (YV12_BUFFER_CONFIG *)0x0) ||
         (pYVar12 = (pAVar13->tpl_data).src_ref_frame[uVar39], pYVar12 == (YV12_BUFFER_CONFIG *)0x0)
         ) {
        tpl_stats.mv[uVar39].as_int = 0x80008000;
      }
      else {
        iVar36 = (pYVar12->field_4).field_0.y_stride;
        local_520 = (uint8_t *)CONCAT44(local_520._4_4_,iVar36);
        local_4e0 = (pYVar12->field_5).field_0.y_buffer + (iVar36 * local_4c8 + local_43c);
        local_54c = (pYVar12->field_0).field_0.y_width;
        best_rfidx_mv.as_int = 0;
        center_mvs[2].mv = (int_mv)0x0;
        center_mvs[2].sad = 0x7fffffff;
        center_mvs[3].mv = (int_mv)0x0;
        center_mvs[3].sad = 0x7fffffff;
        center_mvs[0].mv = (int_mv)0x0;
        center_mvs[0].sad = 0x7fffffff;
        center_mvs[1].mv = (int_mv)0x0;
        center_mvs[1].sad = 0x7fffffff;
        _Var6 = (x->e_mbd).up_available;
        local_530 = 1;
        if (_Var6 == true) {
          iVar10 = *(int_mv *)
                    ((long)(*(int *)((long)local_4b0 + 0x40) * local_440 +
                           (iVar44 >> (bVar7 & 0x1f))) * 200 + *(long *)((long)local_4b0 + 8) + 0xa4
                    + uVar39 * 4);
          iVar36 = is_alike_mv(iVar10,center_mvs,1,(cpi_00->sf).tpl_sf.skip_alike_starting_mv);
          local_530 = 1;
          if (iVar36 == 0) {
            center_mvs[1].mv.as_int = iVar10.as_int;
            local_530 = 2;
          }
        }
        uVar46 = local_530;
        if ((x->e_mbd).left_available == true) {
          iVar10 = *(int_mv *)
                    ((long)(*(int *)((long)local_4b0 + 0x40) * (iVar37 >> (bVar7 & 0x1f)) +
                           ((int)(iVar44 - local_420) >> (bVar7 & 0x1f))) * 200 +
                     *(long *)((long)local_4b0 + 8) + 0xa4 + uVar39 * 4);
          iVar30 = (int)local_530;
          iVar36 = is_alike_mv(iVar10,center_mvs,iVar30,(cpi_00->sf).tpl_sf.skip_alike_starting_mv);
          if (iVar36 == 0) {
            center_mvs[uVar46].mv = iVar10;
            local_530 = (ulong)(iVar30 + 1);
          }
        }
        uVar42 = local_498;
        uVar46 = local_530;
        if ((_Var6 != false) && ((int)uVar48 < (x->e_mbd).tile.mi_col_end)) {
          iVar10 = *(int_mv *)
                    ((long)(*(int *)((long)local_4b0 + 0x40) * local_440 +
                           ((int)uVar48 >> (bVar7 & 0x1f))) * 200 + *(long *)((long)local_4b0 + 8) +
                     0xa4 + uVar39 * 4);
          iVar30 = (int)local_530;
          iVar36 = is_alike_mv(iVar10,center_mvs,iVar30,(cpi_00->sf).tpl_sf.skip_alike_starting_mv);
          if (iVar36 == 0) {
            center_mvs[uVar46 & 0xffffffff].mv = iVar10;
            local_530 = (ulong)(iVar30 + 1);
          }
        }
        uVar45 = (uint)local_530;
        local_2e8 = uVar39;
        if (1 < uVar45 && (cpi_00->sf).tpl_sf.prune_starting_mv != 0) {
          uVar46 = local_530 & 0xffffffff;
          for (uVar39 = 0; uVar45 * 8 != uVar39; uVar39 = uVar39 + 8) {
            FVar23 = get_fullmv_from_mv((MV *)((long)&center_mvs[0].mv + uVar39));
            iVar32 = (int)FVar23.row;
            iVar30 = (int)FVar23 >> 0x10;
            iVar36 = (x->mv_limits).col_max;
            if (iVar30 < iVar36) {
              iVar36 = iVar30;
            }
            sVar35 = (short)iVar36;
            iVar36 = (x->mv_limits).col_min;
            if (iVar30 < iVar36) {
              sVar35 = (short)iVar36;
            }
            iVar36 = (x->mv_limits).row_max;
            if (iVar32 < iVar36) {
              iVar36 = iVar32;
            }
            sVar22 = (short)iVar36;
            iVar36 = (x->mv_limits).row_min;
            if (iVar32 < iVar36) {
              sVar22 = (short)iVar36;
            }
            uVar24 = (*local_4f8->ppi->fn_ptr[uVar42].sdf)
                               (local_508,(int)local_548,
                                local_4e0 + ((int)sVar35 + sVar22 * (int)local_520),(int)local_520);
            *(uint *)((long)&center_mvs[0].sad + uVar39) = uVar24;
          }
          qsort(center_mvs,uVar46,8,compare_sad);
          uVar24 = 4 - (local_4f8->sf).tpl_sf.prune_starting_mv;
          uVar45 = (uint)local_530;
          if ((int)uVar24 < (int)(uint)local_530) {
            uVar45 = uVar24;
          }
          cpi_00 = local_4f8;
          if ((1 < (int)uVar45) &&
             (center_mvs[uVar45 - 2].sad <
              (center_mvs[uVar45 - 1].sad - center_mvs[uVar45 - 2].sad) * 5)) {
            uVar45 = uVar45 - 1;
          }
        }
        if ((int)uVar45 < 1) {
          uVar45 = 0;
        }
        uVar46 = (ulong)uVar45;
        local_4e8 = (SequenceHeader *)CONCAT44(local_4e8._4_4_,0xffffffff);
        local_530 = uVar46;
        for (uVar42 = 0; uVar39 = local_2e8, uVar46 != uVar42; uVar42 = uVar42 + 1) {
          local_438 = center_mvs[uVar42].mv;
          FVar23 = get_fullmv_from_mv(&local_438.as_mv);
          x->plane[0].src.buf = local_508;
          x->plane[0].src.stride = (int)local_548;
          x->plane[0].src.width = iVar53;
          (x->e_mbd).plane[0].pre[0].buf = local_4e0;
          (x->e_mbd).plane[0].pre[0].stride = (int)local_520;
          (x->e_mbd).plane[0].pre[0].width = local_54c;
          iVar36 = (cpi_00->sf).tpl_sf.reduce_first_step_size;
          if (8 < iVar36) {
            iVar36 = 9;
          }
          search_sites = (cpi_00->mv_search_params).search_site_cfg[1];
          if ((cpi_00->mv_search_params).search_site_cfg[0][0].stride == (int)local_520) {
            search_sites = (cpi_00->mv_search_params).search_site_cfg[0];
          }
          av1_make_default_fullpel_ms_params
                    (&full_ms_params,cpi_00,x,(BLOCK_SIZE)local_518,&local_438.as_mv,FVar23,
                     search_sites,(cpi_00->sf).tpl_sf.search_method,0);
          if ((cpi_00->sf).mv_sf.subpel_search_method == '\0') {
            cost_list_00 = (int *)0x0;
          }
          else {
            cost_list_00 = cost_list;
            if ((cpi_00->sf).mv_sf.use_fullpel_costlist == 0) {
              cost_list_00 = (int *)0x0;
            }
          }
          uVar45 = av1_full_pixel_search
                             (FVar23,&full_ms_params,iVar36,cost_list_00,&this_mv.as_fullmv,
                              &best_mv_stats,(FULLPEL_MV *)0x0);
          if ((cpi_00->sf).tpl_sf.subpel_force_stop == '\x03') {
            this_mv.as_int = (this_mv.as_int >> 0x10) * 0x80000 + (this_mv.as_int & 0x1fff) * 8;
          }
          else {
            av1_make_default_subpel_ms_params
                      ((SUBPEL_MOTION_SEARCH_PARAMS *)yv12_mb,cpi_00,x,(BLOCK_SIZE)local_518,
                       &local_438.as_mv,cost_list);
            uVar46 = local_530;
            yv12_mb[0][0].width._0_1_ = (cpi_00->sf).tpl_sf.subpel_force_stop;
            yv12_mb[1][0].buf._0_1_ = 1;
            yv12_mb[0][1].height._0_1_ = 4;
            best_mv_stats.err_cost = 0;
            uVar45 = (*(cpi_00->mv_search_params).find_fractional_mv_step)
                               (local_488,local_490,(SUBPEL_MOTION_SEARCH_PARAMS *)yv12_mb,
                                (MV)((this_mv.as_int >> 0x10) * 0x80000 +
                                    (this_mv.as_int & 0x1fff) * 8),&best_mv_stats,&this_mv.as_mv,
                                &distortion,&sse,(int_mv *)0x0);
          }
          if (uVar45 < (uint)local_4e8) {
            best_rfidx_mv = this_mv;
            local_4e8 = (SequenceHeader *)CONCAT44(local_4e8._4_4_,uVar45);
          }
        }
        tpl_stats.mv[local_2e8] = best_rfidx_mv;
        single_mv[local_2e8] = best_rfidx_mv;
        uVar45 = get_inter_cost(cpi_00,local_488,local_508,(int)local_548,tpl_tmp_buffers,
                                (BLOCK_SIZE)local_518,(TX_SIZE)local_510,(int)local_500,
                                (int)local_538,(int)local_2e8,&best_rfidx_mv.as_mv,
                                *(int *)((long)local_4b0 + 0x5c));
        uVar46 = 1;
        if (1 < (int)uVar45) {
          uVar46 = (ulong)uVar45;
        }
        tpl_stats.pred_error[uVar39] = uVar46;
        uVar31 = local_4cc;
        if ((int)uVar45 < (int)local_554) {
          local_4d8 = CONCAT44(local_4d8._4_4_,best_rfidx_mv.as_int);
          local_460 = uVar39 & 0xffffffff;
          local_554 = uVar45;
        }
      }
      uVar39 = uVar39 + 1;
    }
    if (local_554 == 0x7fffffff) {
      local_554 = 0x7fffffff;
    }
    else {
      iVar53 = (int)local_460;
      if (*(int *)((long)local_4b0 + 0x5c) != 0) {
        local_554 = get_inter_cost(cpi_00,local_488,local_508,(int)local_548,tpl_tmp_buffers,
                                   (BLOCK_SIZE)local_518,(TX_SIZE)local_510,(int)local_500,
                                   (int)local_538,iVar53,(MV *)&local_4d8,0);
      }
      if ((iVar53 != -1) && ((int)local_554 < (int)local_524)) {
        (*(x->e_mbd).mi)->ref_frame[0] = (char)uVar46 + '\x01';
        (*(x->e_mbd).mi)->mv[0].as_int = (uint32_t)local_4d8._0_4_;
        mode_00 = '\x10';
      }
    }
    iVar53 = (cpi_00->sf).tpl_sf.allow_compound_pred;
    (x->e_mbd).mi_row = (int)local_500;
    (x->e_mbd).mi_col = (int)local_538;
    local_54c = 0xffffffff;
    local_4e8 = (SequenceHeader *)CONCAT44(local_4e8._4_4_,iVar53);
    for (uVar39 = 0; (iVar53 != 0 && (uVar39 < 3)); uVar39 = uVar39 + 1) {
      iVar37 = (&DAT_0045e310)[uVar39 * 2];
      if (((pAVar13->tpl_data).ref_frame[iVar37] != (YV12_BUFFER_CONFIG *)0x0) &&
         (cVar15 = *(center_mv_t *)((pAVar13->tpl_data).src_ref_frame + iVar37),
         cVar15 != (center_mv_t)0x0)) {
        iVar44 = (&DAT_0045e314)[uVar39 * 2];
        if (((pAVar13->tpl_data).ref_frame[iVar44] != (YV12_BUFFER_CONFIG *)0x0) &&
           (cVar16 = *(center_mv_t *)((pAVar13->tpl_data).src_ref_frame + iVar44),
           cVar16 != (center_mv_t)0x0)) {
          center_mvs[0] = cVar15;
          center_mvs[1] = cVar16;
          (*(x->e_mbd).mi)->ref_frame[0] = (char)iVar37 + '\x01';
          (*(x->e_mbd).mi)->ref_frame[1] = (char)iVar44 + '\x01';
          ppMVar38 = (x->e_mbd).mi;
          pMVar27 = *ppMVar38;
          pMVar27->mode = '\x18';
          cVar47 = pMVar27->ref_frame[0];
          bVar7 = pMVar27->ref_frame[1];
          if ('\0' < (char)bVar7) {
            if (bVar7 < 5 || '\x04' < cVar47) {
              for (lVar50 = 0; lVar50 != 9; lVar50 = lVar50 + 1) {
                if ((cVar47 == (&comp_ref0_lut)[lVar50]) && (bVar7 == (&comp_ref1_lut)[lVar50])) {
                  cVar47 = (char)lVar50 + '\x14';
                  goto LAB_0020c4fb;
                }
              }
            }
            cVar47 = bVar7 * '\x04' + cVar47 + -0xd;
          }
LAB_0020c4fb:
          local_520 = (uint8_t *)CONCAT44(local_520._4_4_,single_mv[iVar37].as_int);
          *(uint32_t *)
           ((long)&local_2f0->ref_mv_stack[cVar47][0].this_mv +
           (ulong)(*(ushort *)&pMVar27->field_0xa7 >> 1 & 0x18)) = single_mv[iVar37].as_int;
          local_4e0 = (uint8_t *)CONCAT44(local_4e0._4_4_,single_mv[iVar44].as_int);
          *(uint32_t *)
           ((long)&local_2f0->ref_mv_stack[cVar47][0].comp_mv +
           (ulong)(*(ushort *)&(*ppMVar38)->field_0xa7 >> 1 & 0x18)) = single_mv[iVar44].as_int;
          pabVar55 = yv12_mb;
          pbVar43 = local_2f8;
          for (lVar50 = 0; lVar50 != 2; lVar50 = lVar50 + 1) {
            scale = (x->e_mbd).block_ref_scale_factors[lVar50];
            av1_setup_pred_block
                      (local_488,yv12_mb[lVar50],(YV12_BUFFER_CONFIG *)center_mvs[lVar50],scale,
                       scale,3);
            pbVar29 = pbVar43;
            for (lVar34 = -0x60; lVar34 != 0; lVar34 = lVar34 + 0x20) {
              puVar2 = (undefined8 *)((long)&pabVar55[1][0].buf + lVar34);
              puVar28 = (uint8_t *)*puVar2;
              puVar19 = (uint8_t *)puVar2[1];
              puVar2 = (undefined8 *)((long)&pabVar55[1][0].width + lVar34);
              uVar20 = *puVar2;
              uVar21 = puVar2[1];
              pbVar29->width = (int)uVar20;
              pbVar29->height = (int)((ulong)uVar20 >> 0x20);
              *(undefined8 *)&pbVar29->stride = uVar21;
              pbVar29->buf = puVar28;
              pbVar29->buf0 = puVar19;
              pbVar29 = (buf_2d *)((long)(pbVar29 + 0x51) + 0x10);
            }
            pabVar55 = pabVar55 + 1;
            pbVar43 = pbVar43 + 1;
          }
          cost_list[0] = (int)local_520;
          cost_list[1] = (int)local_4e0;
          cur_mv = (int_mv *)cost_list;
          av1_joint_motion_search
                    (local_4f8,x,(BLOCK_SIZE)local_518,cur_mv,(uint8_t *)0x0,0,
                     &best_mv_stats.err_cost,(uint)((local_4f8->sf).mv_sf.disable_second_mv == 0),2)
          ;
          for (lVar50 = 0; lVar50 != 2; lVar50 = lVar50 + 1) {
            cVar15 = center_mvs[lVar50];
            full_ms_params._136_8_ = *(undefined8 *)((long)cVar15 + 0x28);
            full_ms_params.fast_obmc_search = *(int *)cVar15;
            full_ms_params._148_4_ = *(undefined4 *)((long)cVar15 + 8);
            full_ms_params.mv_cost_params.ref_mv._0_4_ = *(undefined4 *)((long)cVar15 + 0x20);
            full_ms_params.mv_cost_params.mvcost[0]._0_4_ = (x->e_mbd).bd;
            full_ms_params.mv_cost_params.mvcost[0]._4_4_ =
                 (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
            full_ms_params.mesh_patterns[0]._0_4_ = local_4c8;
            full_ms_params.mesh_patterns[0]._4_4_ = local_43c;
            full_ms_params.mv_cost_params.full_ref_mv.row = 0;
            full_ms_params.mv_cost_params.full_ref_mv.col = 0;
            full_ms_params.mv_cost_params.mv_cost_type = '\0';
            full_ms_params.mv_cost_params._13_3_ = 0;
            full_ms_params.sdf._4_4_ = 0;
            full_ms_params.sdx4df = (aom_sad_multi_d_fn_t)0xfffb9000fffb9000;
            full_ms_params.mv_limits._8_8_ = local_2e0;
            full_ms_params._104_8_ = local_2d8;
            full_ms_params.mesh_patterns[1] = (MESH_PATTERN *)0x0;
            full_ms_params.bsize = BLOCK_4X4;
            full_ms_params._1_7_ = 0x1000000;
            full_ms_params.ms_buffers.wsrc = (int32_t *)(x->e_mbd).tmp_conv_dst;
            full_ms_params.ms_buffers.obmc_mask._4_4_ =
                 (int)full_ms_params.mv_cost_params.mvcost[0] + -7;
            if ((int)full_ms_params.mv_cost_params.mvcost[0] < 0xb) {
              full_ms_params.ms_buffers.obmc_mask._4_4_ = 3;
            }
            full_ms_params.ms_buffers.mask_stride = (int)lVar50;
            full_ms_params.ms_buffers.obmc_mask._0_4_ = 0x80;
            full_ms_params.search_method = '\a';
            full_ms_params._73_7_ = 0;
            full_ms_params.search_sites = (search_site_config *)0x1;
            full_ms_params.mesh_search_mv_diff_threshold = dst_stride;
            full_ms_params.force_mesh_thresh = bh;
            full_ms_params.mv_cost_params.mvjcost = &(pAVar13->tpl_data).sf.x_scale_fp;
            av1_enc_build_one_inter_predictor
                      (dst,dst_stride,&cur_mv->as_mv,(InterPredParams *)&full_ms_params);
            cur_mv = cur_mv + 1;
          }
          uVar48 = tpl_get_satd_cost(local_458,local_4b8,dst_stride,local_508,(int)local_548,dst,
                                     dst_stride,local_4c0,dst_stride,bh,(TX_SIZE)local_510);
          if ((int)uVar48 < (int)local_554) {
            local_4d8 = CONCAT44(cost_list[1],cost_list[0]);
            local_554 = uVar48;
            local_54c = (uint)uVar39;
          }
          iVar53 = (uint)local_4e8;
        }
      }
    }
    local_548 = (long)(int)local_54c;
    TVar61 = (TX_SIZE)local_510;
    iVar53 = (int)local_500;
    if ((local_54c == 0xffffffff) || ((int)local_524 <= (int)local_554)) {
      iVar37 = 0;
      if ((local_554 != 0x7fffffff) && (0xf3 < (byte)(mode_00 - 0x19))) goto LAB_0020c8fe;
    }
    else {
      cVar47 = *(char *)(&DAT_0045e314 + local_548 * 2);
      (*(x->e_mbd).mi)->ref_frame[0] = *(char *)(&DAT_0045e310 + local_548 * 2) + '\x01';
      (*(x->e_mbd).mi)->ref_frame[1] = cVar47 + '\x01';
      mode_00 = '\x18';
LAB_0020c8fe:
      (*(x->e_mbd).mi)->mv[0].as_int = (uint32_t)local_4d8._0_4_;
      (*(x->e_mbd).mi)->mv[1].as_int = local_4d8._4_4_;
      if ((int)local_54c < 0) {
        iVar37 = (int)local_460;
        full_ms_params.vfp = (aom_variance_fn_ptr_t *)0x0;
      }
      else {
        iVar37 = (&DAT_0045e310)[(ulong)local_54c * 2];
        full_ms_params.vfp =
             (aom_variance_fn_ptr_t *)
             (pAVar13->tpl_data).src_ref_frame[(int)(&DAT_0045e314)[(ulong)local_54c * 2]];
      }
      full_ms_params._0_8_ = (pAVar13->tpl_data).src_ref_frame[iVar37];
      rate_cost = 1;
      get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b8,local_4c0,local_480,
                          local_478,local_490,x,(YV12_BUFFER_CONFIG **)&full_ms_params,&local_348,
                          rec_stride_pool,TVar61,mode_00,iVar53,(int)local_538,(int)local_470,0,
                          in_stack_fffffffffffffa98);
      tpl_stats.srcrf_rate = rate_cost;
      lVar33 = recon_error;
      local_3c8 = pred_error;
      iVar37 = rate_cost;
    }
    tpl_stats.intra_cost = local_524;
    if ((int)local_524 < 2) {
      tpl_stats.intra_cost = 1;
    }
    tpl_stats.inter_cost = local_554;
    if (tpl_stats.intra_cost < (int)local_554) {
      tpl_stats.inter_cost = tpl_stats.intra_cost;
    }
    tpl_stats.srcrf_sse = local_3c8 << 4;
    rate_cost = 0;
    if (mode_00 == '\x18') {
      full_ms_params._0_8_ = (pAVar13->tpl_data).ref_frame[(int)(&DAT_0045e310)[local_548 * 2]];
      full_ms_params.vfp =
           (aom_variance_fn_ptr_t *)
           (pAVar13->tpl_data).ref_frame[(int)(&DAT_0045e314)[local_548 * 2]];
    }
    else {
      if ((int)local_460 < 0) {
        full_ms_params._0_8_ = (YV12_BUFFER_CONFIG *)0x0;
      }
      else {
        full_ms_params._0_8_ = (pAVar13->tpl_data).ref_frame[local_460 & 0xffffffff];
      }
      full_ms_params.vfp = (aom_variance_fn_ptr_t *)0x0;
    }
    tpl_stats.srcrf_dist = lVar33 << 4;
    get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b8,local_4c0,local_480,local_478,
                        local_490,x,(YV12_BUFFER_CONFIG **)&full_ms_params,&local_348,
                        rec_stride_pool,TVar61,mode_00,iVar53,(int)local_538,(int)local_470,1,
                        in_stack_fffffffffffffa98);
    lVar50 = recon_error * 0x10;
    tpl_stats.recrf_sse = pred_error << 4;
    lVar33 = lVar33 << 4;
    if ((byte)(mode_00 - 0x19) < 0xf4) {
      tpl_stats.srcrf_rate = rate_cost;
      lVar33 = lVar50;
      iVar37 = rate_cost;
      tpl_stats.srcrf_sse = tpl_stats.recrf_sse;
      tpl_stats.srcrf_dist = lVar50;
    }
    if (lVar50 < lVar33) {
      lVar50 = lVar33;
    }
    iVar53 = rate_cost;
    if (rate_cost < iVar37) {
      iVar53 = iVar37;
    }
    tpl_stats.recrf_dist = lVar50;
    tpl_stats.recrf_rate = iVar53;
    if (mode_00 == '\x18') {
      local_508 = (uint8_t *)(long)(int)(&DAT_0045e310)[local_548 * 2];
      full_ms_params._0_8_ = (pAVar13->tpl_data).ref_frame[(long)local_508];
      local_548 = (long)(int)(&DAT_0045e314)[local_548 * 2];
      full_ms_params.vfp = (aom_variance_fn_ptr_t *)(pAVar13->tpl_data).src_ref_frame[local_548];
      iVar44 = (int)local_538;
      get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b8,local_4c0,local_480,
                          local_478,local_490,x,(YV12_BUFFER_CONFIG **)&full_ms_params,&local_348,
                          rec_stride_pool,(TX_SIZE)local_510,'\x18',(int)local_500,iVar44,
                          (int)local_470,1,in_stack_fffffffffffffa98);
      tpl_stats.cmp_recrf_dist[0] = recon_error * 0x10;
      if (recon_error * 0x10 < lVar33) {
        tpl_stats.cmp_recrf_dist[0] = lVar33;
      }
      if (rate_cost < iVar37) {
        rate_cost = iVar37;
      }
      if (lVar50 < tpl_stats.cmp_recrf_dist[0]) {
        tpl_stats.cmp_recrf_dist[0] = lVar50;
      }
      tpl_stats.cmp_recrf_rate[0] = rate_cost;
      if (iVar53 < rate_cost) {
        tpl_stats.cmp_recrf_rate[0] = iVar53;
      }
      rate_cost = 0;
      full_ms_params._0_8_ = (pAVar13->tpl_data).src_ref_frame[(long)local_508];
      full_ms_params.vfp = (aom_variance_fn_ptr_t *)(pAVar13->tpl_data).ref_frame[local_548];
      get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b8,local_4c0,local_480,
                          local_478,local_490,x,(YV12_BUFFER_CONFIG **)&full_ms_params,&local_348,
                          rec_stride_pool,(TX_SIZE)local_510,'\x18',(int)local_500,iVar44,
                          (int)local_470,1,in_stack_fffffffffffffa98);
      tpl_stats.cmp_recrf_dist[1] = recon_error * 0x10;
      if (recon_error * 0x10 < lVar33) {
        tpl_stats.cmp_recrf_dist[1] = lVar33;
      }
      tpl_stats.cmp_recrf_rate[1] = rate_cost;
      if (rate_cost < iVar37) {
        tpl_stats.cmp_recrf_rate[1] = iVar37;
      }
      if (lVar50 < tpl_stats.cmp_recrf_dist[1]) {
        tpl_stats.cmp_recrf_dist[1] = lVar50;
      }
      if (iVar53 < tpl_stats.cmp_recrf_rate[1]) {
        tpl_stats.cmp_recrf_rate[1] = iVar53;
      }
      tpl_stats.ref_frame_index[1] = (int8_t)local_548;
      tpl_stats.ref_frame_index[0] = (char)local_508;
      *(MV *)(tpl_stats.mv + (char)local_508) = local_4d8._0_4_;
      tpl_stats.mv[tpl_stats.ref_frame_index[1]].as_int = local_4d8._4_4_;
      iVar37 = (int)local_468;
    }
    else {
      iVar37 = (int)local_468;
      if (mode_00 == '\x10') {
        *(MV *)(tpl_stats.mv + (int)local_460) = local_4d8._0_4_;
        tpl_stats.ref_frame_index[1] = -1;
        tpl_stats.ref_frame_index[0] = (int8_t)local_460;
      }
    }
    iVar53 = local_448;
    cpi = local_4f8;
    for (iVar44 = 0; iVar44 != iVar37; iVar44 = iVar44 + 1) {
      for (lVar33 = 0; uVar18 != (uint)lVar33; lVar33 = lVar33 + 1) {
        if (((int)(uint)lVar33 < (int)(((x->e_mbd).mb_to_right_edge >> 5) + uVar18)) &&
           (iVar44 - iVar37 < (x->e_mbd).mb_to_bottom_edge >> 5)) {
          ppMVar38 = (x->e_mbd).mi;
          ppMVar38[(long)iVar44 * (long)(local_4f8->common).mi_params.mi_stride + lVar33] =
               *ppMVar38;
        }
      }
    }
    bVar7 = (pAVar11->tpl_data).tpl_stats_block_mis_log2;
    pTVar17 = local_300->tpl_stats_ptr;
    iVar37 = ((int)local_538 >> (bVar7 & 0x1f)) +
             ((int)local_500 >> (bVar7 & 0x1f)) * local_300->stride;
    memcpy(pTVar17 + iVar37,&tpl_stats,200);
    pAVar54 = local_318;
    uVar45 = pTVar17[iVar37].intra_cost;
    uVar24 = (&pTVar17[iVar37].intra_cost)[1];
    uVar57 = -(uint)(1 < (int)uVar45);
    uVar58 = -(uint)(1 < (int)uVar24);
    uVar18 = pTVar17[iVar37].srcrf_rate;
    uVar48 = (&pTVar17[iVar37].srcrf_rate)[1];
    uVar59 = -(uint)(1 < (int)uVar18);
    uVar60 = -(uint)(1 < (int)uVar48);
    piVar3 = &pTVar17[iVar37].intra_cost;
    *piVar3 = ~uVar57 & 1 | uVar45 & uVar57;
    piVar3[1] = ~uVar58 & 1 | uVar24 & uVar58;
    piVar3[2] = ~uVar59 & 1 | uVar18 & uVar59;
    piVar3[3] = ~uVar60 & 1 | uVar48 & uVar60;
    lVar33 = 1;
    lVar50 = pTVar17[iVar37].srcrf_dist;
    if (pTVar17[iVar37].srcrf_dist < 2) {
      lVar50 = lVar33;
    }
    lVar34 = pTVar17[iVar37].srcrf_sse;
    if (pTVar17[iVar37].srcrf_sse < 2) {
      lVar34 = lVar33;
    }
    pTVar17[iVar37].srcrf_dist = lVar50;
    pTVar17[iVar37].srcrf_sse = lVar34;
    lVar50 = pTVar17[iVar37].recrf_dist;
    if (pTVar17[iVar37].recrf_dist < 2) {
      lVar50 = lVar33;
    }
    pTVar17[iVar37].recrf_dist = lVar50;
    lVar50 = pTVar17[iVar37].cmp_recrf_dist[0];
    if (pTVar17[iVar37].cmp_recrf_dist[0] < 2) {
      lVar50 = lVar33;
    }
    pTVar17[iVar37].cmp_recrf_dist[0] = lVar50;
    lVar50 = pTVar17[iVar37].cmp_recrf_dist[1];
    if (pTVar17[iVar37].cmp_recrf_dist[1] < 2) {
      lVar50 = lVar33;
    }
    pTVar17[iVar37].cmp_recrf_dist[1] = lVar50;
    uVar18 = pTVar17[iVar37].cmp_recrf_rate[0];
    uVar48 = pTVar17[iVar37].cmp_recrf_rate[1];
    uVar45 = -(uint)(1 < (int)uVar18);
    uVar24 = -(uint)(1 < (int)uVar48);
    pTVar17[iVar37].cmp_recrf_rate[0] = ~uVar45 & 1 | uVar18 & uVar45;
    pTVar17[iVar37].cmp_recrf_rate[1] = ~uVar24 & 1 | uVar48 & uVar24;
    (*(cpi->mt_info).tpl_row_mt.sync_write_ptr)
              (local_318,iVar53,iVar41,((1 << (bVar4 & 0x1f)) >> 1) + iVar9 >> (bVar4 & 0x1f));
    iVar41 = iVar41 + 1;
    local_49c = local_49c + local_444;
  } while( true );
}

Assistant:

void av1_mc_flow_dispenser_row(AV1_COMP *cpi, TplTxfmStats *tpl_txfm_stats,
                               TplBuffers *tpl_tmp_buffers, MACROBLOCK *x,
                               int mi_row, BLOCK_SIZE bsize, TX_SIZE tx_size) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_width = mi_size_wide[bsize];
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_data->frame_idx];
  MACROBLOCKD *xd = &x->e_mbd;

  const int tplb_cols_in_tile =
      ROUND_POWER_OF_TWO(mi_params->mi_cols, mi_size_wide_log2[bsize]);
  const int tplb_row = ROUND_POWER_OF_TWO(mi_row, mi_size_high_log2[bsize]);
  assert(mi_size_high[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));
  assert(mi_size_wide[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));

  for (int mi_col = 0, tplb_col_in_tile = 0; mi_col < mi_params->mi_cols;
       mi_col += mi_width, tplb_col_in_tile++) {
    (*tpl_row_mt->sync_read_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                 tplb_col_in_tile);

#if CONFIG_MULTITHREAD
    if (mt_info->num_workers > 1) {
      pthread_mutex_lock(tpl_row_mt->mutex_);
      const bool tpl_mt_exit = tpl_row_mt->tpl_mt_exit;
      pthread_mutex_unlock(tpl_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (tpl_mt_exit) return;
    }
#endif

    TplDepStats tpl_stats;

    // Motion estimation column boundary
    av1_set_mv_col_limits(mi_params, &x->mv_limits, mi_col, mi_width,
                          tpl_data->border_in_pixels);
    xd->mb_to_left_edge = -GET_MV_SUBPEL(mi_col * MI_SIZE);
    xd->mb_to_right_edge =
        GET_MV_SUBPEL(mi_params->mi_cols - mi_width - mi_col);
    mode_estimation(cpi, tpl_txfm_stats, tpl_tmp_buffers, x, mi_row, mi_col,
                    bsize, tx_size, &tpl_stats);

    // Motion flow dependency dispenser.
    tpl_model_store(tpl_frame->tpl_stats_ptr, mi_row, mi_col, tpl_frame->stride,
                    &tpl_stats, tpl_data->tpl_stats_block_mis_log2);
    (*tpl_row_mt->sync_write_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                  tplb_col_in_tile, tplb_cols_in_tile);
  }
}